

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GSPriorityFloodClass.cpp
# Opt level: O3

Boolean __thiscall GSFloodFill<unsigned_char>::Transform(GSFloodFill<unsigned_char> *this)

{
  _Rb_tree_header *p_Var1;
  iterator *piVar2;
  byte bVar3;
  _Elt_pointer ppVar4;
  _Elt_pointer ppVar5;
  iterator __position;
  pair<int,_int> pVar6;
  Boolean BVar7;
  byte bVar8;
  Boolean **ppBVar9;
  Boolean *pBVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  pair<int,_int> pVar13;
  uchar **ppuVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  pointer ppVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  _Self __tmp;
  ulong uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  XY_t n;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> neighbors;
  pair<int,_int> local_a0;
  pair<double,_std::pair<int,_int>_> local_98;
  ulong local_88;
  ulong local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
  *local_58;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_50;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = this->rows;
  lVar19 = (long)iVar15;
  uVar22 = 0xffffffffffffffff;
  if (-1 < lVar19) {
    uVar22 = lVar19 * 8;
  }
  ppBVar9 = (Boolean **)operator_new__(uVar22);
  this->Closed = ppBVar9;
  if (0 < iVar15) {
    uVar20 = this->cols;
    lVar21 = 0;
    do {
      pBVar10 = (Boolean *)operator_new__((long)(int)uVar20);
      this->Closed[lVar21] = pBVar10;
      if (0 < (int)uVar20) {
        memset(this->Closed[lVar21],0,(ulong)uVar20);
      }
      lVar21 = lVar21 + 1;
    } while (lVar19 != lVar21);
    if (iVar15 == 1) {
      local_98.first._4_4_ = 0;
      local_98.second.first = 0;
      local_98.first._0_1_ = **this->dem;
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
      **this->Closed = true;
      local_98.second.first = this->cols + -1;
      local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,(*this->dem)[(long)this->cols + -1]);
      local_98.first._4_4_ = 0;
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
      (*this->Closed)[(long)this->cols + -1] = true;
      goto LAB_0010716c;
    }
  }
  if (0 < this->cols) {
    lVar21 = 0;
    lVar19 = 0;
    do {
      local_98.first._4_4_ = 0;
      local_98.second.first = (int)((ulong)lVar21 >> 0x20);
      local_98.first._0_1_ = (*this->dem)[lVar19];
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
      (*this->Closed)[lVar19] = true;
      local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,this->dem[(long)this->rows + -1][lVar19])
      ;
      local_98._4_8_ = (ulong)(this->rows - 1) + lVar21;
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
      iVar15 = this->rows;
      this->Closed[(long)iVar15 + -1][lVar19] = true;
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0x100000000;
    } while (lVar19 < this->cols);
  }
  if (2 < iVar15) {
    lVar19 = 1;
    do {
      local_98.first._4_4_ = (undefined4)lVar19;
      local_98.second.first = (int)((ulong)lVar19 >> 0x20);
      local_98.first._0_1_ = *this->dem[lVar19];
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
      *this->Closed[lVar19] = true;
      local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,this->dem[lVar19][(long)this->cols + -1])
      ;
      local_98._4_8_ = ((ulong)(this->cols - 1) << 0x20) + lVar19;
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::_M_emplace_equal<std::pair<unsigned_char,std::pair<int,int>>>
                ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
                  *)&this->Open,(pair<unsigned_char,_std::pair<int,_int>_> *)&local_98);
      this->Closed[lVar19][(long)this->cols + -1] = true;
      lVar19 = lVar19 + 1;
    } while (lVar19 < (long)this->rows + -1);
  }
LAB_0010716c:
  if (this->verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of edges: ",0x11);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    p_Var12 = (this->Open)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->Open)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      iVar15 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Edge ",5);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,": (",3);
        local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,(char)p_Var12[1]._M_color);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") => (",6);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)&p_Var12[1].field_0x4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)&p_Var12[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,")\n",2);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        iVar15 = iVar15 + 1;
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
  }
  local_58 = (_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
              *)&this->Open;
  local_50 = (deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->Pit;
  lVar19 = local_98._4_8_;
LAB_001072bc:
  do {
    ppVar4 = (this->Pit).c.
             super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    ppVar5 = (this->Pit).c.
             super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_98._4_8_ = lVar19;
    if ((this->Open)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      if (ppVar5 == ppVar4) {
        if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return true;
      }
LAB_001072f8:
      uVar20 = ppVar4->first;
      local_88 = (ulong)(uint)ppVar4->second;
      std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
                ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_50);
    }
    else {
      if (ppVar5 != ppVar4) goto LAB_001072f8;
      __position._M_node = (this->Open)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar20 = *(uint *)&__position._M_node[1].field_0x4;
      local_88 = (ulong)*(uint *)&__position._M_node[1]._M_parent;
      std::
      _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
      ::erase_abi_cxx11_(local_58,__position);
    }
    if (this->verbose != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Processing cell (",0x11);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar20);
      local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,0x2c);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), elevation= ",0xe);
      poVar11 = std::ostream::_M_insert<double>((double)this->dem[(int)uVar20][(int)local_88]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
    if (((int)uVar20 < 0) || (this->rows <= (int)uVar20)) {
      iVar15 = this->verbose;
LAB_0010753c:
      lVar21 = 0x30;
      pcVar17 = "\tIgnoring the cell, as it is not within the DEM.";
      lVar19 = local_98._4_8_;
joined_r0x0010754a:
      if (iVar15 != 0) {
        local_98._4_8_ = lVar19;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,lVar21);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        lVar19 = local_98._4_8_;
      }
      goto LAB_001072bc;
    }
    uVar22 = local_88 << 0x20;
    iVar15 = this->verbose;
    if (((long)uVar22 < 0) || (this->cols <= (int)local_88)) goto LAB_0010753c;
    if (iVar15 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\tCell is within the DEM.",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    local_80 = (ulong)uVar20;
    BVar7 = neighborsOf(this,(XY_t)(uVar22 | local_80),&local_78);
    iVar15 = this->verbose;
    if (!BVar7) {
      lVar21 = 0x17;
      pcVar17 = "\tCell has no neighbors.";
      lVar19 = local_98._4_8_;
      goto joined_r0x0010754a;
    }
    if (iVar15 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\tCell has ",10);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," neighbors.",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_48,&local_78);
    if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar22 = 0xffffffffffffffff;
    }
    else {
      uVar22 = 0xffffffff;
      uVar23 = 0;
      uVar24 = 0x406fe000;
      uVar16 = 0xffffffff;
      ppVar18 = local_48.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        dVar25 = (double)this->dem[ppVar18->first][ppVar18->second];
        if (dVar25 <= (double)CONCAT44(uVar24,uVar23) && (double)CONCAT44(uVar24,uVar23) != dVar25)
        {
          uVar22 = (ulong)(uint)ppVar18->second;
          uVar16 = ppVar18->first;
        }
        if ((double)CONCAT44(uVar24,uVar23) <= dVar25) {
          dVar25 = (double)CONCAT44(uVar24,uVar23);
        }
        ppVar18 = ppVar18 + 1;
        uVar23 = SUB84(dVar25,0);
        uVar24 = (undefined4)((ulong)dVar25 >> 0x20);
      } while (ppVar18 !=
               local_48.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      uVar22 = (ulong)uVar16 | uVar22 << 0x20;
    }
    if (local_48.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar19 = local_98._4_8_;
    if (this->verbose != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\tNeighbor with minimal elevation is (",0x25);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar22);
      local_98.first._0_1_ = 0x2c;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)(uVar22 >> 0x20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), whose elevation is ",0x16);
      local_98.first._0_4_ =
           CONCAT31(local_98.first._1_3_,this->dem[(int)uVar22][(long)uVar22 >> 0x20]);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_98,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      lVar19 = local_98._4_8_;
      if (this->verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\tFor all neighbors, do:",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        lVar19 = local_98._4_8_;
      }
    }
    local_98.second.first = (int)((ulong)lVar19 >> 0x20);
    local_98.first._4_4_ = (undefined4)lVar19;
    dVar25 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
    if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      lVar21 = (long)(int)local_88;
      ppVar18 = local_78.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pVar13 = *ppVar18;
        ppBVar9 = this->Closed;
        local_a0 = pVar13;
        local_98.first = dVar25;
        if (ppBVar9[pVar13.first][(long)pVar13 >> 0x20] == true) {
          if (this->verbose != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\t\tNeighbor (",0xc);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
            local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,0x2c);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") has been already ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"encountered -- ignoring it.",0x1b);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            dVar25 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
          }
        }
        else {
          if (this->verbose == 0) {
            local_a0.second = pVar13.second;
            pVar6 = pVar13;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\t\tProcessing neighbor (",0x17);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
            local_98.first._0_1_ = 0x2c;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"):",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "\t\t\tCalculating max(current neighbor, popped cell), i.e. max(dem[",0x40);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"][",2);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"], dem[",7);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"][",2);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)local_88);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]) = ",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"max(",4);
            local_98.first._0_1_ = this->dem[local_a0.first][local_a0.second];
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
            local_98.first._0_1_ = this->dem[local_80][lVar21];
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") = ",4);
            bVar3 = this->dem[local_a0.first][local_a0.second];
            local_98.first._0_1_ = this->dem[local_80][lVar21];
            if (local_98.first._0_1_ < bVar3) {
              local_98.first._0_1_ = bVar3;
            }
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\t\t\tElevating cell (",0x13);
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
            local_98.first._0_1_ = 0x2c;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") from ",7);
            local_98.first._0_1_ = this->dem[local_a0.first][local_a0.second];
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
            bVar3 = this->dem[local_a0.first][local_a0.second];
            bVar8 = this->dem[local_80][lVar21];
            if (bVar8 < bVar3) {
              bVar8 = bVar3;
            }
            local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,bVar8);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)&local_98,1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            dVar25 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
            ppBVar9 = this->Closed;
            pVar13 = (pair<int,_int>)((ulong)local_a0 & 0xffffffff);
            pVar6 = local_a0;
          }
          local_a0 = pVar6;
          lVar19 = (long)local_a0.second;
          ppBVar9[pVar13.first][lVar19] = true;
          ppuVar14 = this->dem;
          lVar19 = (long)local_a0.second;
          local_98.first = dVar25;
          if (ppuVar14[local_80][lVar21] < ppuVar14[pVar13.first][lVar19]) {
            if (this->verbose != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"\t\t\tPush cell (",0xe);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
              local_98.first._0_1_ = 0x2c;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,") onto stack Open with priority ",0x20);
              local_98.first._0_4_ =
                   CONCAT31(local_98.first._1_3_,this->dem[local_a0.first][local_a0.second]);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              ppuVar14 = this->dem;
            }
            local_98.first = (double)ppuVar14[ppVar18->first][ppVar18->second];
            local_98.second.first = (*ppVar18).first;
            local_98.second.second = (*ppVar18).second;
            std::
            _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::pair<int,int>>,std::_Select1st<std::pair<unsigned_char_const,std::pair<int,int>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::pair<int,int>>>>
            ::_M_emplace_equal<std::pair<double,std::pair<int,int>>>(local_58,&local_98);
            dVar25 = local_98.first;
          }
          else {
            lVar19 = (long)local_a0.second;
            ppuVar14[pVar13.first][lVar19] = ppuVar14[local_80][lVar21];
            if (this->verbose != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"\t\t\tPush cell (",0xe);
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_a0.first);
              local_98.first._0_4_ = CONCAT31(local_98.first._1_3_,0x2c);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)&local_98,1);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_a0.second);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,") onto queue Pit",0x10);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              dVar25 = (double)CONCAT44(local_98.first._4_4_,local_98.first._0_4_);
            }
            ppVar4 = (this->Pit).c.
                     super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (ppVar4 == (this->Pit).c.
                          super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              local_98.first = dVar25;
              std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_push_back_aux<std::pair<int,int>const&>(local_50,&local_a0);
              dVar25 = local_98.first;
            }
            else {
              *ppVar4 = local_a0;
              piVar2 = &(this->Pit).c.
                        super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar2->_M_cur = piVar2->_M_cur + 1;
            }
          }
        }
        local_98.first._4_4_ = (undefined4)((ulong)dVar25 >> 0x20);
        local_98.first._0_4_ = SUB84(dVar25,0);
        lVar19 = CONCAT44(local_98.second.first,local_98.first._4_4_);
        ppVar18 = ppVar18 + 1;
      } while (ppVar18 !=
               local_78.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  } while( true );
}

Assistant:

Boolean GSFloodFill<T>::Transform() {
	int i, j;
	XY_t xy, c;
	PrIterator_t it;
	vector<XY_t> neighbors;

	 /////////////// 
	// Algorithm 2 //
	 ///////////////

	// Let Closed have the same dimensions as DEM
	// Let Closed be initialized to false
	Closed = new Boolean* [rows];
	for (i=0; i<rows; i++) {
		Closed[i] = new Boolean [cols];
		for (j=0; j<cols; j++) {
			Closed[i][j] = false;
		}
	}

	if (rows == 1) { // monodimensional case
		xy = pair<int,int>(0, 0);
		Open.insert(pair<T,XY_t>(dem[0][0], xy));
		Closed[0][0] = true;
		xy = pair<int,int>(0, cols-1);
		Open.insert(pair<T,XY_t>(dem[0][cols-1], xy));
		Closed[0][cols-1] = true;
	} else {		// bidimensional case
		// for all edges of DEM do
		for (j=0; j<cols; j++) {
			xy = pair<int,int>(0, j);
			Open.insert(pair<T,XY_t>(dem[0][j], xy));
			Closed[0][j] = true;
			xy = pair<int,int>(rows-1, j);
			Open.insert(pair<T,XY_t>(dem[rows-1][j], xy));
			Closed[rows-1][j] = true;
		}
		for (i=1; i<rows-1; i++) {
			xy = pair<int,int>(i, 0);
			Open.insert(pair<T,XY_t>(dem[i][0], xy));
			Closed[i][0] = true;
			xy = pair<int,int>(i,cols-1);
			Open.insert(pair<T,XY_t>(dem[i][cols-1], xy));
			Closed[i][cols-1] = true;
		}
	}

	if (verbose) {
		std::cout << "Number of edges: " << Open.size() << std::endl;
		for (it=Open.begin(), i=1; it != Open.end(); it++, i++)
				std::cout << "Edge " << i << ": (" << it->first << ") => (" << it->second.first
					<< ", " << it->second.second << ")\n";
	}



	// while either Open or Pit is not empty do
	while ( ! Open.empty() || ! Pit.empty() ) {
		if ( ! Pit.empty() ) {
			c=Pit.front();
			Pit.pop();
		} else {
			PrioPop(Open,c);
		}

		// An edge was found on either Open or Pit
		if (verbose)
			std::cerr << "Processing cell (" << c.first << ',' << c.second << "), elevation= " << (Real) dem[c.first][c.second]  << std::endl;
		
		if (! isWithin(c)) {
			if (verbose)
				std::cerr << "\tIgnoring the cell, as it is not within the DEM." << std::endl;
			continue;
		}

		// The edge is within the DEM
		if (verbose)
			std::cerr << "\tCell is within the DEM." << std::endl;

		// neighbors lists the neighbors of c
		if (! neighborsOf(c, neighbors)) {
			if (verbose)
				std::cerr << "\tCell has no neighbors." << std::endl;
			continue;
		}
		// Here, neighbors contains the neighbors of c
		if (verbose)
			std::cerr << "\tCell has " << neighbors.size() << " neighbors." << std::endl;
		

		// miNeighbor is the coordinates of the cell with minimal elevation
		XY_t miNeighbor = miNeighbors(neighbors);
		if (verbose)
			std::cerr << "\tNeighbor with minimal elevation is (" << miNeighbor.first << ',' << miNeighbor.second
				 << "), whose elevation is " << dem[miNeighbor.first][miNeighbor.second] << "." << std::endl;

		
		if (verbose)
			std::cerr << "\tFor all neighbors, do:" << std::endl;



		for (vector<XY_t>::iterator nit = neighbors.begin(); nit != neighbors.end(); nit++) {
			XY_t n = *nit;

			if (isClosed(n)) {
				if (verbose)
					std::cerr << "\t\tNeighbor (" << n.first << ',' << n.second << ") has been already "
					<< "encountered -- ignoring it." << std::endl;

				continue;
			}

			if (verbose) {
				std::cerr << "\t\tProcessing neighbor (" << n.first << ',' << n.second << "):" << std::endl;

				std::cerr << "\t\t\tCalculating max(current neighbor, popped cell), i.e. max(dem[" 
					<< n.first << "][" << n.second << "], dem[" << c.first << "][" << c.second << "]) = "
					<< "max(" << dem[n.first][n.second] << ", " << dem[c.first][c.second] << ") = "
					<< std::max(dem[n.first][n.second], dem[c.first][c.second]) << std::endl;

				std::cerr << "\t\t\tElevating cell (" << n.first << ',' << n.second << ") from " << dem[n.first][n.second]
					<< " to " << std::max(dem[n.first][n.second], dem[c.first][c.second]) << std::endl;
			}

			Closed[n.first][n.second] = true;

			if (dem[n.first][n.second] <= dem[c.first][c.second]) {
				dem[n.first][n.second] = dem[c.first][c.second];

				if (verbose)
					std::cerr << "\t\t\tPush cell (" << n.first << ',' << n.second << ") onto queue Pit" << std::endl;

				Pit.push(n);
			} else {
				if (verbose)
					std::cerr << "\t\t\tPush cell (" << n.first << ',' << n.second << ") onto stack Open with priority "
						<< dem[n.first][n.second] << std::endl;

				// Push n onto Open with priority DEM(n)
				Open.insert(pair<Real,XY_t>(dem[nit->first][nit->second], *nit));
			}
		}
	}

	return true;
}